

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O0

int __thiscall ArithmeticBitModel::init(ArithmeticBitModel *this,EVP_PKEY_CTX *ctx)

{
  ArithmeticBitModel *this_local;
  
  this->bit_0_count = 1;
  this->bit_count = 2;
  this->bit_0_prob = 0x1000;
  this->bits_until_update = 4;
  this->update_cycle = 4;
  return (int)this;
}

Assistant:

void ArithmeticBitModel::init()
{
  // initialization to equiprobable model
  bit_0_count = 1;
  bit_count   = 2;
  bit_0_prob  = 1U << (BM__LengthShift - 1);
  // start with frequent updates
  update_cycle = bits_until_update = 4;
}